

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReactorUtils.H
# Opt level: O0

void __thiscall
pele::physics::reactions::utils::FlattenOps<pele::physics::reactions::utils::YCOrder>::unflatten
          (FlattenOps<pele::physics::reactions::utils::YCOrder> *this,Box *box,int ncells,
          int reactor_type,bool clean_init_massfrac,Array4<double> *rhoY,Array4<double> *temperature
          ,Array4<double> *rhoE,Array4<double> *frcEExt,Array4<double> *FC_in,Real *y_vect,
          Real *vect_energy,long *FCunt,Real dt)

{
  int *in_RSI;
  byte in_R8B;
  void *in_R9;
  undefined8 in_XMM0_Qa;
  void *in_stack_00000008;
  void *in_stack_00000010;
  void *in_stack_00000018;
  void *in_stack_00000020;
  undefined8 in_stack_00000038;
  Dim3 lo;
  Dim3 len;
  undefined1 auStackY_2a0 [24];
  anon_class_392_14_5e52f3aa *in_stack_fffffffffffffd78;
  Box *in_stack_fffffffffffffd80;
  undefined1 auStack_260 [64];
  undefined1 auStack_220 [64];
  undefined1 auStack_1e0 [64];
  undefined1 auStack_1a0 [80];
  undefined8 local_150;
  undefined8 local_148;
  undefined8 local_140;
  int local_138;
  undefined8 local_12c;
  int local_124;
  undefined8 local_120;
  int local_118;
  undefined8 local_110;
  int local_108;
  undefined8 local_100;
  byte local_e9;
  undefined8 local_d0;
  int local_c8;
  int local_b8;
  int iStack_b4;
  int local_b0;
  undefined4 local_ac;
  undefined4 local_9c;
  int *local_98;
  undefined4 local_8c;
  undefined4 local_7c;
  int *local_78;
  undefined4 local_6c;
  undefined4 local_5c;
  int *local_58;
  undefined8 local_50;
  int local_48;
  int local_38;
  int iStack_34;
  int local_30;
  undefined4 local_2c;
  undefined4 local_1c;
  undefined4 local_c;
  
  local_e9 = in_R8B & 1;
  local_58 = in_RSI + 3;
  local_5c = 0;
  local_6c = 0;
  local_b8 = (*local_58 - *in_RSI) + 1;
  local_78 = in_RSI + 3;
  local_7c = 1;
  local_8c = 1;
  iStack_b4 = (in_RSI[4] - in_RSI[1]) + 1;
  local_98 = in_RSI + 3;
  local_9c = 2;
  local_ac = 2;
  local_118 = (in_RSI[5] - in_RSI[2]) + 1;
  local_120 = CONCAT44(iStack_b4,local_b8);
  local_c = 0;
  local_38 = *in_RSI;
  local_1c = 1;
  iStack_34 = in_RSI[1];
  local_140 = *(undefined8 *)in_RSI;
  local_2c = 2;
  local_138 = in_RSI[2];
  local_12c = local_140;
  local_124 = local_138;
  local_110 = local_120;
  local_108 = local_118;
  local_100 = in_XMM0_Qa;
  local_d0 = local_120;
  local_c8 = local_118;
  local_b0 = local_118;
  local_50 = local_140;
  local_48 = local_138;
  local_30 = local_138;
  memcpy(auStackY_2a0,in_R9,0x3c);
  memcpy(auStack_260,in_stack_00000008,0x3c);
  memcpy(auStack_220,in_stack_00000010,0x3c);
  memcpy(auStack_1e0,in_stack_00000018,0x3c);
  memcpy(auStack_1a0,in_stack_00000020,0x3c);
  local_150 = in_stack_00000038;
  local_148 = local_100;
  amrex::
  ParallelFor<pele::physics::reactions::utils::FlattenOps<pele::physics::reactions::utils::YCOrder>::unflatten(amrex::Box_const&,int,int,bool,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,double*,double*,long*,double)::_lambda(int,int,int)_1_>
            (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  return;
}

Assistant:

void unflatten(
    const amrex::Box& box,
    const int ncells,
    const int reactor_type,
    const bool clean_init_massfrac,
    amrex::Array4<amrex::Real> const& rhoY,
    amrex::Array4<amrex::Real> const& temperature,
    amrex::Array4<amrex::Real> const& rhoE,
    amrex::Array4<amrex::Real> const& frcEExt,
    amrex::Array4<amrex::Real> const& FC_in,
    amrex::Real* y_vect,
    amrex::Real* vect_energy,
    long int* FCunt,
    amrex::Real dt)
  {
    BL_PROFILE("Pele::unflatten()");
    const auto len = amrex::length(box);
    const auto lo = amrex::lbound(box);
    amrex::ParallelFor(box, [=] AMREX_GPU_DEVICE(int i, int j, int k) noexcept {
      const int icell =
        (k - lo.z) * len.x * len.y + (j - lo.y) * len.x + (i - lo.x);
      box_unflatten<OrderType>(
        icell, i, j, k, ncells, reactor_type, clean_init_massfrac, rhoY,
        temperature, rhoE, frcEExt, FC_in, y_vect, vect_energy, FCunt[icell],
        dt);
    });
  }